

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void kratos::CombinationalLoopVisitor::check_var(Var *var)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  StmtException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined8 *puVar4;
  initializer_list<kratos::IRNode_*> __l;
  string_view format_str;
  format_args args;
  IRNode *local_b8;
  Var *local_b0;
  string local_a8;
  pointer local_88;
  pointer ppIStack_80;
  pointer local_68;
  undefined8 uStack_60;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_48;
  undefined8 uStack_30;
  allocator_type local_21;
  
  iVar2 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
  puVar4 = *(undefined8 **)(CONCAT44(extraout_var,iVar2) + 0x10);
  do {
    if (puVar4 == (undefined8 *)0x0) {
      return;
    }
    if (*(int *)(puVar4[1] + 0xd0) == 0) {
      bVar1 = has_var(*(Var **)(puVar4[1] + 200),var);
      if (bVar1) {
        lVar3 = (**(code **)(*(long *)puVar4[1] + 0x20))();
        if (*(int *)(lVar3 + 0x48) == 0) {
          this = (StmtException *)__cxa_allocate_exception(0x10);
          (**(code **)(**(long **)(puVar4[1] + 0xc0) + 0xf8))(&local_88);
          (**(code **)(**(long **)(puVar4[1] + 200) + 0xf8))(&local_68);
          local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = local_88;
          local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppIStack_80;
          local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_68;
          uStack_30 = uStack_60;
          format_str.size_ = 0xdd;
          format_str.data_ = (char *)0x29;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_48;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_a8,(detail *)"Combinational loop detected at {0} <- {1}",format_str,args
                    );
          local_b8 = (IRNode *)puVar4[1];
          __l._M_len = 2;
          __l._M_array = &local_b8;
          local_b0 = var;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    (&local_48,__l,&local_21);
          StmtException::StmtException(this,&local_a8,&local_48);
          __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    puVar4 = (undefined8 *)*puVar4;
  } while( true );
}

Assistant:

static void check_var(Var* var) {
        // get all the sources
        auto const& sources = var->sources();
        for (auto const& stmt : sources) {
            if (stmt->assign_type() == AssignmentType::Blocking && has_var(stmt->right(), var) &&
                stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind) {
                throw StmtException(::format("Combinational loop detected at {0} <- {1}",
                                             stmt->left()->to_string(), stmt->right()->to_string()),
                                    {stmt.get(), var});
            }
        }
    }